

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.cpp
# Opt level: O0

VariablePairPtr __thiscall libcellml::AnyCellmlElement::variablePair(AnyCellmlElement *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  undefined8 *in_RSI;
  shared_ptr<libcellml::VariablePair> sVar2;
  VariablePairPtr VVar3;
  bad_any_cast *anon_var_0;
  AnyCellmlElement *this_local;
  
  if ((*(int *)*in_RSI == 2) || (*(int *)*in_RSI == 5)) {
    sVar2 = std::any_cast<std::shared_ptr<libcellml::VariablePair>>((any *)this);
    _Var1 = sVar2.super___shared_ptr<libcellml::VariablePair,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  }
  else {
    std::shared_ptr<libcellml::VariablePair>::shared_ptr
              ((shared_ptr<libcellml::VariablePair> *)this,(nullptr_t)0x0);
    _Var1._M_pi = extraout_RDX;
  }
  VVar3.super___shared_ptr<libcellml::VariablePair,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var1._M_pi;
  VVar3.super___shared_ptr<libcellml::VariablePair,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (VariablePairPtr)
         VVar3.super___shared_ptr<libcellml::VariablePair,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

VariablePairPtr AnyCellmlElement::variablePair() const
{
    if ((mPimpl->mType == CellmlElementType::CONNECTION)
        || (mPimpl->mType == CellmlElementType::MAP_VARIABLES)) {
        try {
            return std::any_cast<VariablePairPtr>(mPimpl->mItem);
        } catch (const std::bad_any_cast &) {
            return nullptr;
        }
    }

    return nullptr;
}